

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterSetIndentString(xmlTextWriterPtr writer,xmlChar *str)

{
  xmlChar *pxVar1;
  
  if (str != (xmlChar *)0x0 && writer != (xmlTextWriterPtr)0x0) {
    if (writer->ichar != (xmlChar *)0x0) {
      (*xmlFree)(writer->ichar);
    }
    pxVar1 = xmlStrdup(str);
    writer->ichar = pxVar1;
    return -(uint)(pxVar1 == (xmlChar *)0x0);
  }
  return -1;
}

Assistant:

int
xmlTextWriterSetIndentString(xmlTextWriterPtr writer, const xmlChar * str)
{
    if ((writer == NULL) || (!str))
        return -1;

    if (writer->ichar != NULL)
        xmlFree(writer->ichar);
    writer->ichar = xmlStrdup(str);

    if (!writer->ichar)
        return -1;
    else
        return 0;
}